

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this_ipp.hpp
# Opt level: O3

shared_ptr<duckdb::Event,_true> __thiscall
duckdb::enable_shared_from_this<duckdb::Event>::shared_from_this
          (enable_shared_from_this<duckdb::Event> *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 *in_RSI;
  shared_ptr<duckdb::Event,_true> sVar4;
  __weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_18._M_ptr = (element_type *)*in_RSI;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  if (local_18._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_refcount._M_pi)->_M_weak_count = (local_18._M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_refcount._M_pi)->_M_weak_count = (local_18._M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  ::std::__shared_ptr<duckdb::Event,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<duckdb::Event,void>
            ((__shared_ptr<duckdb::Event,(__gnu_cxx::_Lock_policy)2> *)this,&local_18);
  _Var3._M_pi = extraout_RDX;
  if (local_18._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_18._M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_18._M_refcount._M_pi)->_M_weak_count;
      (local_18._M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_18._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  sVar4.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Event,_true>)
         sVar4.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> shared_from_this() { // NOLINT: invalid case style
		return shared_ptr<T>(__weak_this_);
	}